

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O1

void TestBlockWrite(uint wlen_max,AmpIO *wboard,AmpIO *rboard)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ostream *poVar8;
  ushort uVar9;
  uint offset;
  ulong uVar10;
  quadlet_t *pqVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  double dVar19;
  quadlet_t waveform_read [512];
  quadlet_t waveform [512];
  short local_1088;
  uint local_1080;
  quadlet_t local_1038;
  quadlet_t local_1034 [7];
  uint local_1018;
  quadlet_t local_ff8 [4];
  ushort local_fe6;
  quadlet_t local_838 [514];
  
  uVar5 = BoardIO::GetFpgaVersionMajor((BoardIO *)rboard);
  if ((uVar5 & 0xfffffffe) == 2) {
    bVar3 = FpgaIO::ReadEthernetData(&rboard->super_FpgaIO,&local_1038,0x80,0x10);
    bVar16 = true;
    bVar17 = true;
    if ((bVar3) && (bVar17 = local_1038 != 0x32474244, bVar17)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Debug data not available",0x18);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Will only perform read/write test",0x21);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      bVar17 = true;
    }
    if (wlen_max < 3) {
      iVar7 = 0;
    }
    else {
      offset = 0x4a0;
      if (uVar5 == 2) {
        offset = 0x90;
      }
      uVar15 = 0;
      uVar13 = 2;
      uVar14 = 0x20000;
      uVar9 = 0;
      iVar7 = 0;
      local_1080 = wlen_max;
      do {
        bVar16 = uVar13 < 10;
        iVar12 = (int)uVar13;
        bVar3 = 0xccccccc < ((uint)(iVar12 * -0x33333333) >> 2 | iVar12 * 0x40000000);
        bVar18 = uVar13 == wlen_max - 1;
        if (uVar5 == 2) {
          dVar19 = (double)(iVar12 * 3 - 2) / 5.0;
        }
        else {
          dVar19 = (double)(iVar12 - 1) * 0.5;
        }
        if (!bVar3 || (bVar16 || bVar18)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Len=",4);
          *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
               *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2
          ;
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
          if (!bVar17) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"trigger = ",10);
            poVar8 = std::ostream::_M_insert<double>(dVar19);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", trigger_fpga = ",0x11);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
          }
        }
        memset(&local_1038,0,uVar15 * 4 + 8);
        pqVar11 = local_838;
        uVar10 = uVar13;
        uVar6 = uVar14;
        do {
          *pqVar11 = (uint)uVar10 | uVar6;
          pqVar11 = pqVar11 + 1;
          uVar6 = uVar6 + 0x10000;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
        bVar4 = AmpIO::WriteWaveformTable(wboard,local_838,0,(unsigned_short)uVar13);
        if (bVar4) {
          Amp1394_Sleep(0.05);
          if (bVar17) {
LAB_0010950f:
            bVar4 = AmpIO::ReadWaveformTable(rboard,&local_1038,0,(unsigned_short)uVar13);
            if (!bVar4) {
              if (bVar3 && (!bVar16 && !bVar18)) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Len=",4);
                *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
                     *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) &
                     0xffffffb5 | 2;
                poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"ReadWaveformTable failed",0x18);
              iVar12 = 2;
              goto LAB_00109790;
            }
            if (local_1038 == local_838[0]) {
              uVar10 = 0;
              do {
                if (uVar15 + 1 == uVar10) {
                  bVar4 = uVar13 <= uVar10 + 1;
                  goto LAB_0010993e;
                }
                pqVar11 = local_1034 + uVar10;
                uVar1 = uVar10 + 1;
                lVar2 = uVar10 + 1;
                uVar10 = uVar1;
              } while (*pqVar11 == local_838[lVar2]);
              bVar4 = uVar13 <= uVar1;
            }
            else {
              bVar4 = false;
            }
            if (bVar3 && (!bVar16 && !bVar18)) {
              iVar7 = iVar7 + 1;
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"mismatch at quadlet ",0x14);
              *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
                   *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5
                   | 2;
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,", read ",7);
              *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                   *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 8;
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,", expected ",0xb);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              if (iVar7 != 0) {
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
                std::ostream::put(-0x20);
                poVar8 = (ostream *)std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"There were ",0xb);
                *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                     *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
                poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8," additional lengths with mismatches",0x23);
              }
              iVar7 = 0;
            }
LAB_0010993e:
            if (bVar3 && (!bVar16 && !bVar18)) {
              iVar12 = 0;
              bVar16 = true;
              goto LAB_001097bb;
            }
            iVar12 = 0;
            bVar16 = true;
            if ((bool)(bVar4 & bVar17)) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," Pass",5);
            }
            goto LAB_00109793;
          }
          bVar4 = FpgaIO::ReadEthernetData(&rboard->super_FpgaIO,&local_1038,0x80,0x10);
          iVar12 = 2;
          if ((bVar4) &&
             (bVar4 = FpgaIO::ReadEthernetData(&rboard->super_FpgaIO,local_ff8,offset,5),
             uVar6 = local_1018, bVar4)) {
            if (local_1018 >> 0x10 < local_1080) {
              local_1080 = local_1018 >> 0x10;
            }
            if (uVar9 < local_fe6) {
              uVar9 = local_fe6;
            }
            if (!bVar3 || (bVar16 || bVar18)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"bw_left = ",10);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,", bw_wait = ",0xc);
              std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
              local_1088 = (short)uVar6;
              if (local_1088 < 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,", bw_err_cnt = ",0xf);
                std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
            }
            goto LAB_0010950f;
          }
          bVar16 = false;
        }
        else {
          if (bVar3 && (!bVar16 && !bVar18)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Len=",4);
            *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
                 *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 |
                 2;
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"WriteWaveformTable failed",0x19);
          iVar12 = 1;
LAB_00109790:
          bVar16 = false;
LAB_00109793:
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
          std::ostream::put(-0x20);
          std::ostream::flush();
        }
LAB_001097bb:
        if (!bVar16) goto LAB_00109a04;
        uVar13 = uVar13 + 1;
        uVar15 = uVar15 + 1;
        uVar14 = uVar14 + 0x10000;
      } while (uVar15 != wlen_max - 2);
      iVar12 = 2;
LAB_00109a04:
      bVar16 = iVar12 == 2;
    }
    if (!bVar16) {
      return;
    }
    if (iVar7 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"There were ",0xb);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8," additional lengths with mismatches",0x23);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
    if (bVar17) {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Mininum bw_left = ",0x12);
    *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," at wlen = ",0xb);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Maximum bw_wait = ",0x12);
    *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," at wlen = ",0xb);
  }
  else {
    poVar8 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TestBlockWrite: unsupported FPGA Version: ",0x2a);
  }
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  return;
}

Assistant:

void TestBlockWrite(unsigned int wlen_max, AmpIO *wboard, AmpIO *rboard)
{
    quadlet_t waveform[MAX_POSSIBLE_DATA_SIZE/sizeof(quadlet_t)];
    quadlet_t waveform_read[MAX_POSSIBLE_DATA_SIZE/sizeof(quadlet_t)];
    unsigned int i;
    unsigned int min_left = wlen_max;
    unsigned int min_wlen = wlen_max;
    unsigned int max_wait = 0;
    unsigned int max_wlen = wlen_max;
    unsigned int numSilentMismatch = 0;

    // Get FPGA Version
    unsigned int fpgaVer = rboard->GetFpgaVersionMajor();
    if ((fpgaVer < 2) || (fpgaVer > 3)) {
        std::cout << "TestBlockWrite: unsupported FPGA Version: " << fpgaVer << std::endl;
        return;
    }

    // Check if debug data available, in which case we can query bw_left
    unsigned int debugVersion = 0;
    if (rboard->ReadEthernetData(waveform_read, 0x80, 16)) {
        char *cptr = reinterpret_cast<char *>(waveform_read);
        if (strncmp(cptr, "DBG2", 4) == 0) {
            debugVersion = 2;
        }
        else {
            std::cout << "Debug data not available" << std::endl;
            std::cout << "Will only perform read/write test" << std::endl;
        }
    }

    for (unsigned int wlen = 2; wlen < wlen_max; wlen++) {
        bool doOut = ((wlen<10)||(wlen%20 == 0)||(wlen==wlen_max-1));
        unsigned int len16 = 2*wlen;  // length in words
        double trigger;               // actual trigger value
        unsigned int trigger_comp;    // trigger computation on FPGA
        if (fpgaVer == 2) {
            trigger_comp = 10 + len16/2+len16/8-len16/64 + 2; // FPGA V2 (KSZ8851)
            trigger = (3*wlen-2)/5.0;
        }
        else {
            trigger_comp = 10 + len16/2 + 2;   // FPGA V3 (RTL8211F)
            trigger = (wlen-1)/2.0;
        }
        if (doOut) {
            std::cout << "Len=" << std::dec << wlen << ": ";
            if (debugVersion) {
                std::cout << "trigger = " << trigger
                          << ", trigger_fpga = " << (trigger_comp-10)/2 << ", ";
            }
        }
        for (i = 0; i < wlen; i++) {
            waveform[i] = ((wlen+i)<< 16) | (wlen-i);
            waveform_read[i] = 0;
        }
        if (!wboard->WriteWaveformTable(waveform, 0, wlen)) {
            if (!doOut) std::cout << "Len=" << std::dec << wlen << ": ";
            std::cout << "WriteWaveformTable failed" << std::endl;
            return;
        }
        Amp1394_Sleep(0.05);
        if (debugVersion) {
            // Read 16 quadlets to get EthernetIO debug data (0x80-0x8f)
            if (!rboard->ReadEthernetData(waveform_read, 0x80, 16))
                break;
            // Read next 5 quadlets to get low-level debug data:
            // KSZ (0x90) or RTI (0x4a0)
            if (!rboard->ReadEthernetData(&waveform_read[16], (fpgaVer == 2) ? 0x90 : 0x4a0, 5))
                break;
            unsigned short bw_left = 0;
            unsigned short bw_wait = 0;
            unsigned int bw_err_cnt = 0;
            bw_left = static_cast<unsigned short>(waveform_read[8]>>16);
            bool bw_err = (waveform_read[8] & 0x00008000);
            if (bw_err) {
                bw_err_cnt++;
            }
            // For both KSZ and RTI, bw_wait is upper word of DebugData[4]
            bw_wait = static_cast<unsigned short>(waveform_read[20]>>16);
            if (bw_left < min_left) {
                min_left = bw_left;
                min_wlen = wlen;
            }
            if (bw_wait > max_wait) {
                max_wait = bw_wait;
                max_wlen = wlen;
            }
            if (doOut) {
                std::cout << "bw_left = " << bw_left << ", bw_wait = " << bw_wait;
                if (bw_err_cnt > 0) {
                    std::cout << ", bw_err_cnt = " << bw_err_cnt;
                    bw_err_cnt = 0;
                }
                std::cout << ", ";
            }
        }
        if (!rboard->ReadWaveformTable(waveform_read, 0, wlen)) {
            if (!doOut) std::cout << "Len=" << std::dec << wlen << ": ";
            std::cout << "ReadWaveformTable failed" << std::endl;
            break;
        }
        bool allOK = true;
        for (i = 0; i < wlen; i++) {
            if (waveform_read[i] != waveform[i]) {
                allOK = false;
                if (doOut) {
                    std::cout << "mismatch at quadlet " << std::dec << i << ", read "
                              << std::hex << waveform_read[i] << ", expected " << waveform[i];
                    if (numSilentMismatch > 0) {
                        std::cout << std::endl << "There were " << std::dec << numSilentMismatch
                                  << " additional lengths with mismatches";
                        numSilentMismatch = 0;
                    }
                }
                else
                    numSilentMismatch++;
                break;
            }
        }
        if (doOut) {
            if (!debugVersion && allOK) std::cout << " Pass";
            std::cout << std::endl;
        }
    }
    if (numSilentMismatch > 0) {
        std::cout << "There were " << numSilentMismatch << " additional lengths with mismatches" << std::endl;
    }
    if (debugVersion) {
        std::cout << "Mininum bw_left = " << std::dec << min_left << " at wlen = " << min_wlen << std::endl;
        std::cout << "Maximum bw_wait = " << std::dec << max_wait << " at wlen = " << max_wlen << std::endl;
    }
}